

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

void __thiscall
Js::JavascriptPromiseAllSettledResolveOrRejectElementFunction::MarkVisitKindSpecificPtrs
          (JavascriptPromiseAllSettledResolveOrRejectElementFunction *this,
          SnapshotExtractor *extractor)

{
  JavascriptPromiseCapability *this_00;
  
  this_00 = (this->super_JavascriptPromiseAllResolveElementFunction).capabilities.ptr;
  if ((((this_00 != (JavascriptPromiseCapability *)0x0) &&
       ((this->super_JavascriptPromiseAllResolveElementFunction).remainingElementsWrapper.ptr !=
        (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)0x0)) &&
      ((this->alreadyCalledWrapper).ptr !=
       (JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *)0x0)) &&
     ((this->super_JavascriptPromiseAllResolveElementFunction).values.ptr != (JavascriptArray *)0x0)
     ) {
    JavascriptPromiseCapability::MarkVisitPtrs(this_00,extractor);
    TTD::SnapshotExtractor::MarkVisitVar
              (extractor,(this->super_JavascriptPromiseAllResolveElementFunction).values.ptr);
    return;
  }
  TTDAbort_unrecoverable_error("Don\'t think these can be null");
}

Assistant:

void JavascriptPromiseAllSettledResolveOrRejectElementFunction::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
    {
        TTDAssert(this->capabilities != nullptr && this->remainingElementsWrapper != nullptr && this->alreadyCalledWrapper != nullptr && this->values != nullptr, "Don't think these can be null");

        this->capabilities->MarkVisitPtrs(extractor);
        extractor->MarkVisitVar(this->values);
    }